

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

string * Imf_2_5::anon_unknown_22::prefixFromLayerName
                   (string *__return_storage_ptr__,string *layerName,Header *header)

{
  bool bVar1;
  __type _Var2;
  StringVector *pSVar3;
  allocator<char> *__a;
  allocator<char> local_1a;
  allocator<char> local_19;
  
  if (layerName->_M_string_length == 0) {
    __a = &local_19;
LAB_001c193e:
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",__a);
  }
  else {
    bVar1 = hasMultiView(header);
    if (bVar1) {
      pSVar3 = multiView_abi_cxx11_(header);
      _Var2 = std::operator==((pSVar3->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,layerName);
      if (_Var2) {
        __a = &local_1a;
        goto LAB_001c193e;
      }
    }
    std::operator+(__return_storage_ptr__,layerName,".");
  }
  return __return_storage_ptr__;
}

Assistant:

string
prefixFromLayerName (const string &layerName, const Header &header)
{
    if (layerName.empty())
	return "";

    if (hasMultiView (header) && multiView(header)[0] == layerName)
	return "";

    return layerName + ".";
}